

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# variables_map.cpp
# Opt level: O2

variable_value * __thiscall program_options::variables_map::get(variables_map *this,string *name)

{
  int iVar1;
  const_iterator cVar2;
  variable_value *pvVar3;
  
  if (get(std::__cxx11::string_const&)::empty == '\0') {
    iVar1 = __cxa_guard_acquire(&get(std::__cxx11::string_const&)::empty);
    if (iVar1 != 0) {
      get::empty.m_value_semantic.
      super___shared_ptr<const_program_options::value_base,_(__gnu_cxx::_Lock_policy)2> =
           (__shared_ptr<const_program_options::value_base,_(__gnu_cxx::_Lock_policy)2>)ZEXT816(0);
      get::empty.v = (any)ZEXT816(0);
      get::empty.m_defaulted = false;
      __cxa_atexit(variable_value::~variable_value,&get::empty,&__dso_handle);
      __cxa_guard_release(&get(std::__cxx11::string_const&)::empty);
    }
  }
  cVar2 = std::
          _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_program_options::variable_value>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_program_options::variable_value>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_program_options::variable_value>_>_>
          ::find(&(this->
                  super_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_program_options::variable_value,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_program_options::variable_value>_>_>
                  )._M_t,name);
  pvVar3 = &get::empty;
  if ((_Rb_tree_header *)cVar2._M_node !=
      &(this->
       super_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_program_options::variable_value,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_program_options::variable_value>_>_>
       )._M_t._M_impl.super__Rb_tree_header) {
    pvVar3 = (variable_value *)(cVar2._M_node + 2);
  }
  return pvVar3;
}

Assistant:

const variable_value& variables_map::get(const std::string& name) const
{
    static variable_value empty;
    const_iterator i = this->find(name);
    if (i == this->end())
        return empty;
    else
        return i->second;
}